

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_operation.c
# Opt level: O2

ASYNC_OPERATION_HANDLE
async_operation_create
          (ASYNC_OPERATION_CANCEL_HANDLER_FUNC async_operation_cancel_handler,size_t context_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ASYNC_OPERATION_HANDLE pAVar3;
  char *pcVar4;
  
  if (async_operation_cancel_handler == (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    pcVar4 = "Cannot allocate memory for async operation";
    iVar1 = 0x19;
  }
  else if (context_size < 8) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    pcVar4 = "Context size too small";
    iVar1 = 0x1f;
  }
  else {
    pAVar3 = (ASYNC_OPERATION_HANDLE)calloc(1,context_size);
    if (pAVar3 != (ASYNC_OPERATION_HANDLE)0x0) {
      pAVar3->async_operation_cancel_handler = async_operation_cancel_handler;
      return pAVar3;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    pcVar4 = "Cannot allocate memory for async operation";
    iVar1 = 0x28;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/async_operation.c"
            ,"async_operation_create",iVar1,1,pcVar4);
  return (ASYNC_OPERATION_HANDLE)0x0;
}

Assistant:

ASYNC_OPERATION_HANDLE async_operation_create(ASYNC_OPERATION_CANCEL_HANDLER_FUNC async_operation_cancel_handler, size_t context_size)
{
    ASYNC_OPERATION_INSTANCE* async_operation;

    if (async_operation_cancel_handler == NULL)
    {
        /* Codes_SRS_ASYNC_OPERATION_01_002: [ If `async_operation_cancel_handler` is NULL, `async_operation_create` shall fail and return NULL.]*/
        LogError("Cannot allocate memory for async operation");
        async_operation = NULL;
    }
    else if (context_size < sizeof(ASYNC_OPERATION_INSTANCE))
    {
        /* Codes_SRS_ASYNC_OPERATION_01_003: [ If `context_size` is less than the size of the `async_operation_cancel_handler` argument, `async_operation_create` shall fail and return NULL.]*/
        LogError("Context size too small");
        async_operation = NULL;
    }
    else
    {
        async_operation = (ASYNC_OPERATION_INSTANCE*)malloc(context_size);
        if (async_operation == NULL)
        {
            /* Codes_SRS_ASYNC_OPERATION_01_004: [ If allocating memory for the new asynchronous operation instance fails, `async_operation_create` shall fail and return NULL.]*/
            LogError("Cannot allocate memory for async operation");
        }
        else
        {
            /* Codes_SRS_ASYNC_OPERATION_01_001: [ `async_operation_create` shall return a non-NULL handle to a newly created asynchronous operation instance.]*/
            (void)memset(async_operation, 0, context_size);
            async_operation->async_operation_cancel_handler = async_operation_cancel_handler;
        }
    }

    return async_operation;
}